

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeFieldMessage
          (ParserImpl *this,Message *message,Reflection *reflection,FieldDescriptor *field)

{
  bool bVar1;
  int iVar2;
  ParseInfoTree *pPVar3;
  undefined4 extraout_var;
  Message *pMVar4;
  AlphaNum *in_R8;
  MessageFactory *local_180;
  MessageFactory *factory;
  undefined1 local_128 [8];
  string delimiter;
  ParseInfoTree *parent;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  string_view local_40;
  FieldDescriptor *local_30;
  FieldDescriptor *field_local;
  Reflection *reflection_local;
  Message *message_local;
  ParserImpl *this_local;
  
  iVar2 = this->recursion_limit_ + -1;
  this->recursion_limit_ = iVar2;
  local_30 = field;
  field_local = (FieldDescriptor *)reflection;
  reflection_local = (Reflection *)message;
  message_local = (Message *)this;
  if (iVar2 < 0) {
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_90,
               "Message is too deep, the parser exceeded the configured recursion limit of ");
    absl::lts_20250127::AlphaNum::AlphaNum(&local_c0,this->initial_recursion_limit_);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,".");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_60,(lts_20250127 *)&local_90,&local_c0,&local_f0,in_R8);
    local_40 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
    ReportError(this,local_40);
    std::__cxx11::string::~string((string *)&local_60);
    this_local._7_1_ = 0;
    goto LAB_00593e48;
  }
  delimiter.field_2._8_8_ = this->parse_info_tree_;
  if ((ParseInfoTree *)delimiter.field_2._8_8_ != (ParseInfoTree *)0x0) {
    pPVar3 = CreateNested((ParseInfoTree *)delimiter.field_2._8_8_,field);
    this->parse_info_tree_ = pPVar3;
  }
  std::__cxx11::string::string((string *)local_128);
  bVar1 = ConsumeMessageDelimiter(this,(string *)local_128);
  if (bVar1) {
    if (this->finder_ == (Finder *)0x0) {
      local_180 = (MessageFactory *)0x0;
    }
    else {
      iVar2 = (*this->finder_->_vptr_Finder[5])(this->finder_,local_30);
      local_180 = (MessageFactory *)CONCAT44(extraout_var,iVar2);
    }
    bVar1 = FieldDescriptor::is_repeated(local_30);
    if (bVar1) {
      pMVar4 = Reflection::AddMessage
                         ((Reflection *)field_local,(Message *)reflection_local,local_30,local_180);
      bVar1 = ConsumeMessage(this,pMVar4,(string *)local_128);
      if (bVar1) goto LAB_00593e0d;
      this_local._7_1_ = 0;
    }
    else {
      pMVar4 = Reflection::MutableMessage
                         ((Reflection *)field_local,(Message *)reflection_local,local_30,local_180);
      bVar1 = ConsumeMessage(this,pMVar4,(string *)local_128);
      if (bVar1) {
LAB_00593e0d:
        this->recursion_limit_ = this->recursion_limit_ + 1;
        this->parse_info_tree_ = (ParseInfoTree *)delimiter.field_2._8_8_;
        this_local._7_1_ = 1;
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  std::__cxx11::string::~string((string *)local_128);
LAB_00593e48:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ConsumeFieldMessage(Message* message, const Reflection* reflection,
                           const FieldDescriptor* field) {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }
    // If the parse information tree is not nullptr, create a nested one
    // for the nested message.
    ParseInfoTree* parent = parse_info_tree_;
    if (parent != nullptr) {
      parse_info_tree_ = CreateNested(parent, field);
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    MessageFactory* factory =
        finder_ ? finder_->FindExtensionFactory(field) : nullptr;
    if (field->is_repeated()) {
      DO(ConsumeMessage(reflection->AddMessage(message, field, factory),
                        delimiter));
    } else {
      DO(ConsumeMessage(reflection->MutableMessage(message, field, factory),
                        delimiter));
    }

    ++recursion_limit_;

    // Reset the parse information tree.
    parse_info_tree_ = parent;
    return true;
  }